

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qproperty.cpp
# Opt level: O2

void __thiscall QBindingStoragePrivate::destroy(QBindingStoragePrivate *this)

{
  QBindingStorageData *ptr;
  size_t *this_00;
  ulong uVar1;
  
  ptr = *this->d;
  if (ptr != (QBindingStorageData *)0x0) {
    this_00 = &ptr[1].used;
    for (uVar1 = 0; uVar1 < ptr->size; uVar1 = uVar1 + 1) {
      if (((QBindingStorageData *)(this_00 + -1))->size != 0) {
        QtPrivate::QPropertyBindingData::~QPropertyBindingData((QPropertyBindingData *)this_00);
        ptr = *this->d;
      }
      this_00 = this_00 + 2;
    }
    QtPrivate::sizedFree(ptr,ptr->size * 0x10 + 0x10);
    return;
  }
  return;
}

Assistant:

void destroy()
    {
        if (!d)
            return;
        Pair *p = pairs(d);
        for (size_t i = 0; i < d->size; ++i) {
            if (p->data)
                p->~Pair();
            ++p;
        }
        const size_t allocSize = sizeof(QBindingStorageData) + d->size*sizeof(Pair);
        QtPrivate::sizedFree(d, allocSize);
    }